

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O1

void __thiscall
Number_NegativeExplicitBase10_Test<wchar_t>::TestBody
          (Number_NegativeExplicitBase10_Test<wchar_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  size_t in_RCX;
  void *in_RDX;
  pointer *__ptr;
  char *message;
  string __str;
  AssertionResult gtest_ar;
  number_long v;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_88;
  AssertHelper local_68;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  number_base local_30;
  undefined8 local_20;
  
  local_30.base_ = 10;
  local_30.super_value._vptr_value = (_func_int **)&PTR__number_base_001f5660;
  local_20 = 0x8000000000000000;
  pstore::dump::value::write(&local_30.super_value,(int)this + 0x10,in_RDX,in_RCX);
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_88,'\x14');
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_88._M_dataplus._M_p + 1),0x13,0x8000000000000000);
  convert<wchar_t>(&local_50,(char *)local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::wstringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            (local_60,"expected","this->out_.str ()",&local_50,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_number.cpp"
               ,0x54,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_88._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
  }
  pstore::dump::number_base::~number_base(&local_30);
  return;
}

Assistant:

TYPED_TEST (Number, NegativeExplicitBase10) {
    const auto value = std::numeric_limits<long long>::min ();
    pstore::dump::number_long v (value, 10);
    v.write (this->out_);
    auto const & expected = convert<TypeParam> (std::to_string (value).c_str ());
    EXPECT_EQ (expected, this->out_.str ());
}